

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

void qlist_write(t_qlist *x,t_symbol *filename,t_symbol *format)

{
  int iVar1;
  char local_418 [8];
  char buf [1000];
  int local_24;
  int cr;
  t_symbol *format_local;
  t_symbol *filename_local;
  t_qlist *x_local;
  
  local_24 = 0;
  canvas_makefilename((x->x_textbuf).b_canvas,filename->s_name,local_418,1000);
  iVar1 = strcmp(format->s_name,"cr");
  if (iVar1 == 0) {
    local_24 = 1;
  }
  else if (*format->s_name != '\0') {
    pd_error(x,"qlist_read: unknown flag: %s",format->s_name);
  }
  iVar1 = binbuf_write((x->x_textbuf).b_binbuf,local_418,"",local_24);
  if (iVar1 != 0) {
    pd_error(x,"%s: write failed",filename->s_name);
  }
  return;
}

Assistant:

static void qlist_write(t_qlist *x, t_symbol *filename, t_symbol *format)
{
    int cr = 0;
    char buf[MAXPDSTRING];
    canvas_makefilename(x->x_canvas, filename->s_name,
        buf, MAXPDSTRING);
    if (!strcmp(format->s_name, "cr"))
        cr = 1;
    else if (*format->s_name)
        pd_error(x, "qlist_read: unknown flag: %s", format->s_name);
    if (binbuf_write(x->x_binbuf, buf, "", cr))
            pd_error(x, "%s: write failed", filename->s_name);
}